

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O2

bool __thiscall GlobOpt::DoCSE(GlobOpt *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar2 = Func::GetSourceContextId(this->func);
  uVar3 = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,CSEPhase,uVar2,uVar3);
  bVar4 = false;
  if ((!bVar1) && (this->prePassLoop == (Loop *)0x0)) {
    uVar2 = Func::GetSourceContextId(this->func);
    uVar3 = Func::GetLocalFunctionId(this->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,CSEPhase,uVar2,uVar3);
    bVar4 = true;
    if (!bVar1) {
      bVar1 = DoFieldOpts(this,this->currentBlock->loop);
      if ((!bVar1) && ((this->field_0xf7 & 2) == 0)) {
        bVar4 = false;
      }
    }
  }
  return bVar4;
}

Assistant:

bool
GlobOpt::DoCSE()
{
    if (PHASE_OFF(Js::CSEPhase, this->func))
    {
        return false;
    }
    if (this->IsLoopPrePass())
    {
        return false;
    }

    if (PHASE_FORCE(Js::CSEPhase, this->func))
    {
        // Force always turn it on
        return true;
    }

    if (!this->DoFieldOpts(this->currentBlock->loop) && !GetIsAsmJSFunc())
    {
        return false;
    }

    return true;
}